

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddTargetItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  bool bVar5;
  TargetType TVar6;
  iterator iVar7;
  bool bVar8;
  cmGeneratorTarget *local_80;
  Item local_78;
  string local_48;
  
  local_80 = target;
  TVar6 = cmGeneratorTarget::GetType(target);
  if (TVar6 != STATIC_LIBRARY) {
    SetCurrentLinkType(this,LinkShared);
  }
  TVar6 = cmGeneratorTarget::GetType(local_80);
  if (TVar6 == SHARED_LIBRARY) {
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_insert_unique<cmGeneratorTarget_const*const&>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)&this->SharedLibrariesLinked,&local_80);
  }
  if ((this->NoSONameUsesPath == true) &&
     (bVar5 = cmGeneratorTarget::IsImportedSharedLibWithoutSOName(local_80,&this->Config), bVar5)) {
    AddSharedLibNoSOName(this,item);
    return;
  }
  sVar2 = (this->LibLinkFileFlag)._M_string_length;
  if (sVar2 != 0) {
    paVar1 = &local_78.Value.field_2;
    pcVar3 = (this->LibLinkFileFlag)._M_dataplus._M_p;
    local_78.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar3,pcVar3 + sVar2);
    local_78.IsPath = false;
    local_78.Target = (cmGeneratorTarget *)0x0;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.Value._M_dataplus._M_p,
                      local_78.Value.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->OldLinkDirMode != true) ||
     (bVar5 = cmGeneratorTarget::IsFrameworkOnApple(local_80), bVar5)) {
    bVar5 = false;
    bVar8 = false;
  }
  else {
    cmsys::SystemTools::GetFilenamePath(&local_48,item);
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->OldLinkDirMask)._M_t,&local_48);
    bVar8 = (_Rb_tree_header *)iVar7._M_node ==
            &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header;
    bVar5 = true;
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OldLinkDirItems,item);
  }
  pcVar4 = local_80;
  paVar1 = &local_78.Value.field_2;
  pcVar3 = (item->_M_dataplus)._M_p;
  local_78.Value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + item->_M_string_length);
  local_78.IsPath = true;
  local_78.Target = pcVar4;
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.Value._M_dataplus._M_p,local_78.Value.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(std::string const& item,
                                             cmGeneratorTarget const* target)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if (target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    this->SetCurrentLinkType(LinkShared);
  }

  // Keep track of shared library targets linked.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    this->SharedLibrariesLinked.insert(target);
  }

  // Handle case of an imported shared library with no soname.
  if (this->NoSONameUsesPath &&
      target->IsImportedSharedLibWithoutSOName(this->Config)) {
    this->AddSharedLibNoSOName(item);
    return;
  }

  // If this platform wants a flag before the full path, add it.
  if (!this->LibLinkFileFlag.empty()) {
    this->Items.push_back(Item(this->LibLinkFileFlag, false));
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
      this->OldLinkDirMask.find(cmSystemTools::GetFilenamePath(item)) ==
        this->OldLinkDirMask.end()) {
    this->OldLinkDirItems.push_back(item);
  }

  // Now add the full path to the library.
  this->Items.push_back(Item(item, true, target));
}